

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electron.cpp
# Opt level: O0

Cycles __thiscall
Electron::ConcreteMachine<true>::perform_bus_operation
          (ConcreteMachine<true> *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  uint8_t uVar1;
  byte bVar2;
  bool bVar3;
  Interrupt interrupt;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  BusState state_00;
  VideoOutput *pVVar7;
  pointer this_00;
  ssize_t sVar8;
  element_type *peVar9;
  pointer this_01;
  pointer pPVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  void *__buf;
  Tape *this_02;
  byte local_f9;
  Cycles local_d0;
  HalfCycles local_c8;
  Cycles local_c0;
  Cycles local_b8;
  HalfCycles local_b0;
  Cycles local_a8;
  Cycles local_a0;
  Cycles local_98;
  Cycles local_90;
  int local_84;
  undefined1 local_80 [4];
  int address_line;
  int local_70;
  char local_69;
  int cycles_left_while_plausibly_in_data;
  uint8_t service_call;
  BusState state;
  uint8_t interruptDisable;
  undefined1 local_50 [24];
  WrappedInt<Cycles> WStack_38;
  bool new_speaker_is_enabled;
  int local_2c;
  byte *pbStack_28;
  uint cycles;
  uint8_t *value_local;
  uint16_t address_local;
  ConcreteMachine<true> *pCStack_18;
  BusOperation operation_local;
  ConcreteMachine<true> *this_local;
  
  local_2c = 1;
  pbStack_28 = value;
  value_local._2_2_ = address;
  value_local._4_4_ = operation;
  pCStack_18 = this;
  if (address < 0x8000) {
    if ((int)operation < 5) {
      *value = this->ram_[address];
    }
    else {
      if (((this->video_access_range_).low_address <= address) &&
         (address <= (this->video_access_range_).high_address)) {
        JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::flush(&this->video_);
      }
      this->ram_[value_local._2_2_] = *pbStack_28;
    }
    pVVar7 = JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::last_valid(&this->video_);
    WStack_38.length_ =
         (IntType)JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::time_since_flush
                            (&this->video_);
    iVar5 = WrappedInt<Cycles>::as<int>(&stack0xffffffffffffffc8);
    uVar6 = VideoOutput::get_cycles_until_next_ram_availability(pVVar7,iVar5 + 1);
    local_2c = uVar6 + local_2c;
  }
  else {
    uVar6 = address & 0xff0f;
    if (uVar6 == 0xfc00) {
      bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->plus3_);
      if ((bVar3) && ((value_local._2_2_ & 0xf0) == 0xc0)) {
        if ((int)value_local._4_4_ < 5) {
          *pbStack_28 = 1;
        }
        else {
          pPVar10 = std::unique_ptr<Electron::Plus3,_std::default_delete<Electron::Plus3>_>::
                    operator->(&this->plus3_);
          Plus3::set_control_register(pPVar10,*pbStack_28);
        }
      }
      if ((value_local._2_2_ & 0xf0) == 0x40) {
        this->scsi_acknowledge_ = true;
        if ((int)value_local._4_4_ < 5) {
          state_00 = SCSI::Bus::get_state(&this->scsi_bus_);
          bVar2 = SCSI::data_lines(state_00);
          *pbStack_28 = bVar2;
          push_scsi_output(this);
        }
        else {
          this->scsi_data_ = *pbStack_28;
          push_scsi_output(this);
        }
      }
    }
    else if (uVar6 == 0xfc01) {
      if (((address & 0xf0) == 0x40) && ((int)operation < 5)) {
        cycles_left_while_plausibly_in_data = SCSI::Bus::get_state(&this->scsi_bus_);
        bVar2 = 0;
        if ((cycles_left_while_plausibly_in_data & 0x800U) != 0) {
          bVar2 = 0x80;
        }
        bVar11 = 0;
        if ((cycles_left_while_plausibly_in_data & 0x8000U) != 0) {
          bVar11 = 0x40;
        }
        bVar12 = 0;
        if ((cycles_left_while_plausibly_in_data & 0x20000U) != 0) {
          bVar12 = 0x20;
        }
        local_f9 = 0;
        if ((this->scsi_interrupt_state_ & 1U) != 0) {
          local_f9 = this->scsi_interrupt_mask_;
        }
        bVar13 = 0;
        if ((local_f9 & 1) != 0) {
          bVar13 = 0x10;
        }
        bVar14 = 0;
        if ((cycles_left_while_plausibly_in_data & 0x1000U) != 0) {
          bVar14 = 2;
        }
        *pbStack_28 = bVar2 | bVar11 | bVar12 | bVar13 | bVar14 |
                      (cycles_left_while_plausibly_in_data & 0x10000U) != 0;
        if (((this->scsi_select_ & 1U) != 0) &&
           (uVar6 = SCSI::Bus::get_state(&this->scsi_bus_), (uVar6 & 0x1000) != 0)) {
          this->scsi_select_ = false;
          push_scsi_output(this);
        }
      }
    }
    else if (uVar6 == 0xfc02) {
      if ((address & 0xf0) == 0x40) {
        this->scsi_select_ = true;
        push_scsi_output(this);
      }
    }
    else if (uVar6 == 0xfc03) {
      if ((address & 0xf0) == 0x40) {
        this->scsi_interrupt_state_ = false;
        this->scsi_interrupt_mask_ = (*value & 1) != 0;
        evaluate_interrupts(this);
      }
    }
    else if (uVar6 - 0xfc04 < 4) {
      bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->plus3_);
      if ((bVar3) && ((value_local._2_2_ & 0xf0) == 0xc0)) {
        if (((this->is_holding_shift_ & 1U) != 0) && (value_local._2_2_ == 0xfcc4)) {
          this->is_holding_shift_ = false;
          set_key_state(this,0xd8,false);
        }
        if ((int)value_local._4_4_ < 5) {
          pPVar10 = std::unique_ptr<Electron::Plus3,_std::default_delete<Electron::Plus3>_>::
                    operator->(&this->plus3_);
          sVar8 = WD::WD1770::read(&pPVar10->super_WD1770,(uint)value_local._2_2_,__buf,
                                   (size_t)value);
          *pbStack_28 = (byte)sVar8;
        }
        else {
          pPVar10 = std::unique_ptr<Electron::Plus3,_std::default_delete<Electron::Plus3>_>::
                    operator->(&this->plus3_);
          WD::WD1770::write(&pPVar10->super_WD1770,(uint)value_local._2_2_,
                            (void *)(ulong)*pbStack_28,(size_t)value);
        }
      }
    }
    else if (uVar6 == 0xfe00) {
      if ((int)operation < 5) {
        *value = this->interrupt_status_;
        this->interrupt_status_ = this->interrupt_status_ & 0xfd;
      }
      else {
        this->interrupt_control_ = *value & 0xfe;
        evaluate_interrupts(this);
      }
    }
    else {
      if (1 < uVar6 - 0xfe02) {
        if (uVar6 == 0xfe04) {
          if ((int)operation < 5) {
            bVar2 = Tape::get_data_register(&this->tape_);
            *pbStack_28 = bVar2;
            Tape::clear_interrupts(&this->tape_,'\x10');
          }
          else {
            Tape::set_data_register(&this->tape_,*value);
            Tape::clear_interrupts(&this->tape_,' ');
          }
          goto LAB_007220d9;
        }
        if (uVar6 == 0xfe05) {
          if (4 < (int)operation) {
            bVar2 = *value;
            service_call = bVar2 & 0xf0;
            if (service_call == 0) {
              this->active_rom_ = *value & 0xf;
              if ((*value & 8) != 0) {
                if ((*value & 4) == 0) {
                  this->keyboard_is_active_ = (bool)(((*value & 2) != 0 ^ 0xffU) & 1);
                  this->basic_is_active_ = (bool)((this->keyboard_is_active_ ^ 0xffU) & 1);
                }
                else {
                  this->keyboard_is_active_ = false;
                  this->basic_is_active_ = false;
                }
              }
            }
            else {
              if ((bVar2 & 0x10) != 0) {
                this->interrupt_status_ = this->interrupt_status_ & 0xfb;
              }
              if ((bVar2 & 0x20) != 0) {
                this->interrupt_status_ = this->interrupt_status_ & 0xf7;
              }
              if ((bVar2 & 0x40) != 0) {
                this->interrupt_status_ = this->interrupt_status_ & 0xbf;
              }
              evaluate_interrupts(this);
            }
          }
          goto LAB_007220d9;
        }
        if (uVar6 == 0xfe06) {
          if (4 < (int)operation) {
            update_audio(this);
            SoundGenerator::set_divider(&this->sound_generator_,*pbStack_28);
            Tape::set_counter(&this->tape_,*pbStack_28);
          }
          goto LAB_007220d9;
        }
        if (uVar6 == 0xfe07) {
          if (4 < (int)operation) {
            local_50[0x17] = (*value & 6) == 2;
            if (local_50[0x17] != (this->speaker_is_enabled_ & 1U)) {
              update_audio(this);
              SoundGenerator::set_is_enabled(&this->sound_generator_,(bool)(local_50[0x17] & 1));
              this->speaker_is_enabled_ = (bool)(local_50[0x17] & 1);
            }
            this_02 = &this->tape_;
            Tape::set_is_enabled(this_02,(~*pbStack_28 & 6) != 0);
            Tape::set_is_in_input_mode(this_02,(*pbStack_28 & 6) == 0);
            Tape::set_is_running(this_02,(bool)(-((*pbStack_28 >> 6 & 1) != 0) & 1));
            value = (uint8_t *)
                    (((ulong)((*pbStack_28 & 0x80) != 0 ^ 0xff) ^ 0xff) & 0xffffffffffffff01);
            this->caps_led_state_ = SUB81(value,0);
            if (this->activity_observer_ != (Observer *)0x0) {
              value = (uint8_t *)((ulong)this->caps_led_state_ & 0xffffffffffffff01);
              (*this->activity_observer_->_vptr_Observer[4])
                        (this->activity_observer_,&this->caps_led,value);
            }
          }
        }
        else if (7 < uVar6 - 0xfe08) {
          if (address < 0xc000) {
            if ((int)operation < 5) {
              *value = this->roms_[this->active_rom_][(int)(address & 0x3fff)];
              if ((this->keyboard_is_active_ & 1U) != 0) {
                *value = *value & 0xf0;
                for (local_84 = 0; local_84 < 0xe; local_84 = local_84 + 1) {
                  if (((uint)address & 1 << ((byte)local_84 & 0x1f)) == 0) {
                    *value = *value | this->key_states_[local_84];
                  }
                }
              }
              if ((this->basic_is_active_ & 1U) != 0) {
                *value = *value & this->roms_[10][(int)(address & 0x3fff)];
              }
            }
            else if ((this->rom_write_masks_[this->active_rom_] & 1U) != 0) {
              this->roms_[this->active_rom_][(int)(address & 0x3fff)] = *value;
            }
          }
          else if ((int)operation < 5) {
            if ((((this->use_fast_tape_hack_ & 1U) == 0) || (operation != ReadOpcode)) ||
               ((((address != 0xf4e5 &&
                  ((((address != 0xf4e6 && (address != 0xf6de)) && (address != 0xf6df)) &&
                   ((address != 0xf6fa && (address != 0xf6fb)))))) && (address != 0xfa51)) &&
                ((address != 0xfa52 && (address != 0xf0a8)))))) {
              *value = this->os_[(int)(address & 0x3fff)];
            }
            else {
              uVar4 = CPU::MOS6502::ProcessorBase::value_of(&(this->m6502_).super_ProcessorBase,X);
              local_69 = (char)uVar4;
              if (value_local._2_2_ == 0xf0a8) {
                if ((this->ram_[0x247] == '\0') && (local_69 == '\x0e')) {
                  Tape::set_delegate(&this->tape_,(Delegate *)0x0);
                  local_70 = 0x32;
                  Tape::clear_interrupts(&this->tape_,'\x10');
                  while( true ) {
                    Storage::Tape::TapePlayer::get_tape((TapePlayer *)local_80);
                    peVar9 = std::
                             __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_80);
                    iVar5 = (**peVar9->_vptr_Tape)();
                    std::shared_ptr<Storage::Tape::Tape>::~shared_ptr
                              ((shared_ptr<Storage::Tape::Tape> *)local_80);
                    if ((((byte)iVar5 ^ 0xff) & 1) == 0) break;
                    Storage::Tape::TapePlayer::run_for_input_pulse(&(this->tape_).super_TapePlayer);
                    local_70 = local_70 + -1;
                    if (local_70 == 0) {
                      this->fast_load_is_in_data_ = false;
                    }
                    bVar2 = Tape::get_interrupt_status(&this->tape_);
                    if (((bVar2 & 0x10) != 0) &&
                       (((this->fast_load_is_in_data_ & 1U) != 0 ||
                        (uVar1 = Tape::get_data_register(&this->tape_), uVar1 == '*')))) break;
                  }
                  Tape::set_delegate(&this->tape_,&this->super_Delegate);
                  Tape::clear_interrupts(&this->tape_,'\x10');
                  bVar2 = Tape::get_interrupt_status(&this->tape_);
                  this->interrupt_status_ = this->interrupt_status_ | bVar2;
                  this->fast_load_is_in_data_ = true;
                  CPU::MOS6502::ProcessorBase::set_value_of(&(this->m6502_).super_ProcessorBase,A,0)
                  ;
                  bVar2 = Tape::get_data_register(&this->tape_);
                  CPU::MOS6502::ProcessorBase::set_value_of
                            (&(this->m6502_).super_ProcessorBase,Y,(ushort)bVar2);
                  *pbStack_28 = 0x60;
                }
                else {
                  *pbStack_28 = this->os_[0x30a8];
                }
              }
              else {
                *pbStack_28 = 0xea;
              }
            }
          }
          goto LAB_007220d9;
        }
      }
      if (4 < (int)value_local._4_4_) {
        JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::operator->
                  ((JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1> *)local_50);
        this_00 = std::
                  unique_ptr<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                  ::operator->((unique_ptr<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                                *)local_50);
        VideoOutput::write(this_00,(uint)value_local._2_2_,(void *)(ulong)*pbStack_28,(size_t)value)
        ;
        std::
        unique_ptr<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                       *)local_50);
        pVVar7 = JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::last_valid(&this->video_);
        state = (BusState)VideoOutput::get_memory_access_range(pVVar7);
        this->video_access_range_ = (Range)state;
      }
    }
  }
LAB_007220d9:
  Cycles::Cycles(&local_90,(long)local_2c);
  bVar3 = JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::operator+=(&this->video_,local_90);
  if (bVar3) {
    pVVar7 = JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::last_valid(&this->video_);
    interrupt = VideoOutput::get_interrupts(pVVar7);
    signal_interrupt(this,interrupt);
  }
  Cycles::Cycles(&local_98,(long)local_2c);
  WrappedInt<Cycles>::operator+=
            (&(this->cycles_since_audio_update_).super_WrappedInt<Cycles>,&local_98);
  Cycles::Cycles(&local_a0,0x4000);
  bVar3 = WrappedInt<Cycles>::operator>
                    (&(this->cycles_since_audio_update_).super_WrappedInt<Cycles>,&local_a0);
  if (bVar3) {
    update_audio(this);
  }
  Cycles::Cycles(&local_a8,(long)local_2c);
  Tape::run_for(&this->tape_,local_a8);
  bVar3 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_TypeRecipient<Electron::CharacterMapper>).typer_);
  if (bVar3) {
    this_01 = std::unique_ptr<Utility::Typer,_std::default_delete<Utility::Typer>_>::operator->
                        (&(this->super_TypeRecipient<Electron::CharacterMapper>).typer_);
    Cycles::Cycles(&local_b8,(long)local_2c);
    HalfCycles::HalfCycles(&local_b0,&local_b8);
    Utility::Typer::run_for(this_01,local_b0);
  }
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->plus3_);
  if (bVar3) {
    pPVar10 = std::unique_ptr<Electron::Plus3,_std::default_delete<Electron::Plus3>_>::operator->
                        (&this->plus3_);
    Cycles::Cycles(&local_c0,(long)(local_2c << 2));
    WD::WD1770::run_for(&pPVar10->super_WD1770,local_c0);
  }
  if ((this->shift_restart_counter_ != 0) &&
     (this->shift_restart_counter_ = this->shift_restart_counter_ - local_2c,
     this->shift_restart_counter_ < 1)) {
    this->shift_restart_counter_ = 0;
    CPU::MOS6502::ProcessorBase::set_power_on(&(this->m6502_).super_ProcessorBase,true);
    set_key_state(this,0xd8,true);
    this->is_holding_shift_ = true;
  }
  if ((this->scsi_is_clocked_ & 1U) != 0) {
    Cycles::Cycles(&local_d0,(long)local_2c);
    HalfCycles::HalfCycles(&local_c8,&local_d0);
    SCSI::Bus::run_for(&this->scsi_bus_,local_c8);
  }
  Cycles::Cycles((Cycles *)&this_local,(long)local_2c);
  return (Cycles)(WrappedInt<Cycles>)this_local;
}

Assistant:

forceinline Cycles perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			unsigned int cycles = 1;

			if(address < 0x8000) {
				if(isReadOperation(operation)) {
					*value = ram_[address];
				} else {
					if(address >= video_access_range_.low_address && address <= video_access_range_.high_address) {
						video_.flush();
					}
					ram_[address] = *value;
				}

				// For the entire frame, RAM is accessible only on odd cycles; in modes below 4
				// it's also accessible only outside of the pixel regions.
				cycles += video_.last_valid()->get_cycles_until_next_ram_availability(video_.time_since_flush().template as<int>() + 1);
			} else {
				switch(address & 0xff0f) {
					case 0xfe00:
						if(isReadOperation(operation)) {
							*value = interrupt_status_;
							interrupt_status_ &= ~PowerOnReset;
						} else {
							interrupt_control_ = (*value) & ~1;
							evaluate_interrupts();
						}
					break;
					case 0xfe07:
						if(!isReadOperation(operation)) {
							// update speaker mode
							bool new_speaker_is_enabled = (*value & 6) == 2;
							if(new_speaker_is_enabled != speaker_is_enabled_) {
								update_audio();
								sound_generator_.set_is_enabled(new_speaker_is_enabled);
								speaker_is_enabled_ = new_speaker_is_enabled;
							}

							tape_.set_is_enabled((*value & 6) != 6);
							tape_.set_is_in_input_mode((*value & 6) == 0);
							tape_.set_is_running((*value & 0x40) ? true : false);

							caps_led_state_ = !!(*value & 0x80);
							if(activity_observer_)
								activity_observer_->set_led_status(caps_led, caps_led_state_);
						}

						[[fallthrough]];	// fe07 contains the display mode.


					case 0xfe02: case 0xfe03:
					case 0xfe08: case 0xfe09: case 0xfe0a: case 0xfe0b:
					case 0xfe0c: case 0xfe0d: case 0xfe0e: case 0xfe0f:
						if(!isReadOperation(operation)) {
							video_->write(address, *value);
							video_access_range_ = video_.last_valid()->get_memory_access_range();
						}
					break;
					case 0xfe04:
						if(isReadOperation(operation)) {
							*value = tape_.get_data_register();
							tape_.clear_interrupts(Interrupt::ReceiveDataFull);
						} else {
							tape_.set_data_register(*value);
							tape_.clear_interrupts(Interrupt::TransmitDataEmpty);
						}
					break;
					case 0xfe05:
						if(!isReadOperation(operation)) {
							const uint8_t interruptDisable = (*value)&0xf0;
							if( interruptDisable ) {
								if( interruptDisable&0x10 ) interrupt_status_ &= ~Interrupt::DisplayEnd;
								if( interruptDisable&0x20 ) interrupt_status_ &= ~Interrupt::RealTimeClock;
								if( interruptDisable&0x40 ) interrupt_status_ &= ~Interrupt::HighToneDetect;
								evaluate_interrupts();

								// TODO: NMI
							} else {
								// Latch the paged ROM in case external hardware is being emulated.
								active_rom_ = *value & 0xf;

								// apply the ULA's test
								if(*value & 0x08) {
									if(*value & 0x04) {
										keyboard_is_active_ = false;
										basic_is_active_ = false;
									} else {
										keyboard_is_active_ = !(*value & 0x02);
										basic_is_active_ = !keyboard_is_active_;
									}
								}
							}
						}
					break;
					case 0xfe06:
						if(!isReadOperation(operation)) {
							update_audio();
							sound_generator_.set_divider(*value);
							tape_.set_counter(*value);
						}
					break;

					case 0xfc04: case 0xfc05: case 0xfc06: case 0xfc07:
						if(plus3_ && (address&0x00f0) == 0x00c0) {
							if(is_holding_shift_ && address == 0xfcc4) {
								is_holding_shift_ = false;
								set_key_state(KeyShift, false);
							}
							if(isReadOperation(operation))
								*value = plus3_->read(address);
							else
								plus3_->write(address, *value);
						}
					break;
					case 0xfc00:
						if(plus3_ && (address&0x00f0) == 0x00c0) {
							if(!isReadOperation(operation)) {
								plus3_->set_control_register(*value);
							} else *value = 1;
						}

						if(has_scsi_bus && (address&0x00f0) == 0x0040) {
							scsi_acknowledge_ = true;
							if(!isReadOperation(operation)) {
								scsi_data_ = *value;
								push_scsi_output();
							} else {
								*value = SCSI::data_lines(scsi_bus_.get_state());
								push_scsi_output();
							}
						}
					break;
					case 0xfc03:
						if(has_scsi_bus && (address&0x00f0) == 0x0040) {
							scsi_interrupt_state_ = false;
							scsi_interrupt_mask_ = *value & 1;
							evaluate_interrupts();
						}
					break;
					case 0xfc01:
						if(has_scsi_bus && (address&0x00f0) == 0x0040 && isReadOperation(operation)) {
							// Status byte is:
							//
							//	b7:	SCSI C/D
							//	b6: SCSI I/O
							//	b5: SCSI REQ
							//	b4: interrupt flag
							//	b3:	0
							//	b2:	0
							//	b1:	SCSI BSY
							//	b0: SCSI MSG
							const auto state = scsi_bus_.get_state();
							*value =
								(state & SCSI::Line::Control ? 0x80 : 0x00) |
								(state & SCSI::Line::Input ? 0x40 : 0x00) |
								(state & SCSI::Line::Request ? 0x20 : 0x00) |
								((scsi_interrupt_state_ && scsi_interrupt_mask_) ? 0x10 : 0x00) |
								(state & SCSI::Line::Busy ? 0x02 : 0x00) |
								(state & SCSI::Line::Message ? 0x01 : 0x00);

							// Empirical guess: this is also the trigger to affect busy/request/acknowledge
							// signalling. Maybe?
							if(scsi_select_ && scsi_bus_.get_state() & SCSI::Line::Busy) {
								scsi_select_ = false;
								push_scsi_output();
							}
						}
					break;
					case 0xfc02:
						if(has_scsi_bus && (address&0x00f0) == 0x0040) {
							scsi_select_ = true;
							push_scsi_output();
						}
					break;

					// SCSI locations:
					//
					//	fc40:	data, read and write
					//	fc41:	status read
					//	fc42:	select write
					//	fc43:	interrupt latch
					//
					//
					// Interrupt latch is:
					//
					//	b0: enable or disable IRQ on REQ
					//	(and, possibly, writing to the latch acknowledges?)

					default:
						if(address >= 0xc000) {
							if(isReadOperation(operation)) {
								if(
									use_fast_tape_hack_ &&
									(operation == CPU::MOS6502::BusOperation::ReadOpcode) &&
									(
										(address == 0xf4e5) || (address == 0xf4e6) ||	// double NOPs at 0xf4e5, 0xf6de, 0xf6fa and 0xfa51
										(address == 0xf6de) || (address == 0xf6df) ||	// act to disable the normal branch into tape-handling
										(address == 0xf6fa) || (address == 0xf6fb) ||	// code, forcing the OS along the serially-accessed ROM
										(address == 0xfa51) || (address == 0xfa52) ||	// pathway.

										(address == 0xf0a8)								// 0xf0a8 is from where a service call would normally be
																						// dispatched; we can check whether it would be call 14
																						// (i.e. read byte) and, if so, whether the OS was about to
																						// issue a read byte call to a ROM despite the tape
																						// FS being selected. If so then this is a get byte that
																						// we should service synthetically. Put the byte into Y
																						// and set A to zero to report that action was taken, then
																						// allow the PC read to return an RTS.
									)
								) {
									const auto service_call = uint8_t(m6502_.value_of(CPU::MOS6502::Register::X));
									if(address == 0xf0a8) {
										if(!ram_[0x247] && service_call == 14) {
											tape_.set_delegate(nullptr);

											int cycles_left_while_plausibly_in_data = 50;
											tape_.clear_interrupts(Interrupt::ReceiveDataFull);
											while(!tape_.get_tape()->is_at_end()) {
												tape_.run_for_input_pulse();
												--cycles_left_while_plausibly_in_data;
												if(!cycles_left_while_plausibly_in_data) fast_load_is_in_data_ = false;
												if(	(tape_.get_interrupt_status() & Interrupt::ReceiveDataFull) &&
													(fast_load_is_in_data_ || tape_.get_data_register() == 0x2a)
												) break;
											}
											tape_.set_delegate(this);
											tape_.clear_interrupts(Interrupt::ReceiveDataFull);
											interrupt_status_ |= tape_.get_interrupt_status();

											fast_load_is_in_data_ = true;
											m6502_.set_value_of(CPU::MOS6502::Register::A, 0);
											m6502_.set_value_of(CPU::MOS6502::Register::Y, tape_.get_data_register());
											*value = 0x60; // 0x60 is RTS
										}
										else *value = os_[address & 16383];
									}
									else *value = 0xea;
								} else {
									*value = os_[address & 16383];
								}
							}
						} else {
							if(isReadOperation(operation)) {
								*value = roms_[active_rom_][address & 16383];
								if(keyboard_is_active_) {
									*value &= 0xf0;
									for(int address_line = 0; address_line < 14; address_line++) {
										if(!(address&(1 << address_line))) *value |= key_states_[address_line];
									}
								}
								if(basic_is_active_) {
									*value &= roms_[int(ROM::BASIC)][address & 16383];
								}
							} else if(rom_write_masks_[active_rom_]) {
								roms_[active_rom_][address & 16383] = *value;
							}
						}
					break;
				}
			}

			if(video_ += Cycles(int(cycles))) {
				signal_interrupt(video_.last_valid()->get_interrupts());
			}

			cycles_since_audio_update_ += Cycles(int(cycles));
			if(cycles_since_audio_update_ > Cycles(16384)) update_audio();
			tape_.run_for(Cycles(int(cycles)));

			if(typer_) typer_->run_for(Cycles(int(cycles)));
			if(plus3_) plus3_->run_for(Cycles(4*int(cycles)));
			if(shift_restart_counter_) {
				shift_restart_counter_ -= cycles;
				if(shift_restart_counter_ <= 0) {
					shift_restart_counter_ = 0;
					m6502_.set_power_on(true);
					set_key_state(KeyShift, true);
					is_holding_shift_ = true;
				}
			}

			if constexpr (has_scsi_bus) {
				if(scsi_is_clocked_) {
					scsi_bus_.run_for(Cycles(int(cycles)));
				}
			}

			return Cycles(int(cycles));
		}